

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

unsigned_short __thiscall
flatbuffers::Table::GetField<unsigned_short>(Table *this,voffset_t field,unsigned_short defaultval)

{
  voffset_t vVar1;
  unsigned_short local_22;
  voffset_t field_offset;
  unsigned_short defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_22 = defaultval;
  if (vVar1 != 0) {
    local_22 = ReadScalar<unsigned_short>(this + (int)(uint)vVar1);
  }
  return local_22;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }